

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_DataStructures_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0041a5c0 == '\x01') {
    DAT_0041a5c0 = '\0';
    (*(code *)*_StringToInt64Map_default_instance_)();
  }
  if (DAT_0041a638 == '\x01') {
    DAT_0041a638 = '\0';
    (*(code *)*_Int64ToStringMap_default_instance_)();
  }
  if (DAT_0041a6b0 == '\x01') {
    DAT_0041a6b0 = '\0';
    (*(code *)*_StringToDoubleMap_default_instance_)();
  }
  if (DAT_0041a728 == '\x01') {
    DAT_0041a728 = '\0';
    (*(code *)*_Int64ToDoubleMap_default_instance_)();
  }
  if (DAT_0041a760 == '\x01') {
    DAT_0041a760 = '\0';
    (*(code *)*_StringVector_default_instance_)();
  }
  if (DAT_0041a790 == '\x01') {
    DAT_0041a790 = '\0';
    (*(code *)*_Int64Vector_default_instance_)();
  }
  if (DAT_0041a7c0 == '\x01') {
    DAT_0041a7c0 = '\0';
    (*(code *)*_FloatVector_default_instance_)();
  }
  if (DAT_0041a7f0 == '\x01') {
    DAT_0041a7f0 = '\0';
    (*(code *)*_DoubleVector_default_instance_)();
  }
  if (DAT_0041a820 == '\x01') {
    DAT_0041a820 = '\0';
    (*(code *)*_Int64Range_default_instance_)();
  }
  if (DAT_0041a850 == '\x01') {
    DAT_0041a850 = '\0';
    (*(code *)*_Int64Set_default_instance_)();
  }
  if (DAT_0041a880 == '\x01') {
    DAT_0041a880 = 0;
    (*(code *)*_DoubleRange_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _StringToInt64Map_default_instance_.Shutdown();
  _Int64ToStringMap_default_instance_.Shutdown();
  _StringToDoubleMap_default_instance_.Shutdown();
  _Int64ToDoubleMap_default_instance_.Shutdown();
  _StringVector_default_instance_.Shutdown();
  _Int64Vector_default_instance_.Shutdown();
  _FloatVector_default_instance_.Shutdown();
  _DoubleVector_default_instance_.Shutdown();
  _Int64Range_default_instance_.Shutdown();
  _Int64Set_default_instance_.Shutdown();
  _DoubleRange_default_instance_.Shutdown();
}